

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kfindxx.cpp
# Opt level: O3

void parse_args(int argc,char **argv,int *min,int *max)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  undefined8 extraout_RAX;
  string arg;
  string local_c8;
  char **local_a8;
  long *local_a0;
  undefined8 local_98;
  long local_90 [2];
  undefined8 local_80;
  long local_78;
  
  if (argc < 2) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,argv[1],(allocator<char> *)&local_c8);
  local_a8 = argv;
  lVar2 = std::__cxx11::string::find((char)&local_a0,0x2e);
  if (lVar2 == -1) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"expected 3 dots (got 0)","");
    abort_parsing(local_a8,&local_c8);
  }
  else {
    lVar2 = std::__cxx11::string::find((char)&local_a0,0x2e);
    if (lVar2 != -1) {
      local_78 = lVar2 + 1;
      lVar2 = std::__cxx11::string::find((char)&local_a0,0x2e);
      if (lVar2 != -1) {
        local_80 = local_98;
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a0);
        parse_range(min,max,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a0);
        paVar1 = &local_c8.field_2;
        parse_range(min + 1,max + 1,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a0);
        parse_range(min + 2,max + 2,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a0);
        parse_range(min + 3,max + 3,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 == local_90) {
          return;
        }
        operator_delete(local_a0,local_90[0] + 1);
        return;
      }
      goto LAB_00102aab;
    }
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"expected 3 dots (got 1)","");
  abort_parsing(local_a8,&local_c8);
LAB_00102aab:
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"expected 3 dots (got 2)","");
  abort_parsing(local_a8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
parse_args(int argc, char *argv[], int min[4], int max[4])
{
    if (argc < 2) {
        return;
    }

    std::string arg{argv[1]};
    std::size_t pos[4];

    pos[0] = arg.find('.');
    if (pos[0] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 0)");
        return;
    }

    pos[1] = arg.find('.', pos[0] + 1);
    if (pos[1] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 1)");
        return;
    }

    pos[2] = arg.find('.', pos[1] + 1);
    if (pos[2] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 2)");
        return;
    }

    pos[3] = arg.size();

    int component_no = 1;
    try {
        parse_range(min[0], max[0], arg.substr(0, pos[0]));
        ++component_no;

        parse_range(min[1], max[1], arg.substr(pos[0] + 1, pos[1] - pos[0] - 1));
        ++component_no;

        parse_range(min[2], max[2], arg.substr(pos[1] + 1, pos[2] - pos[1] - 1));
        ++component_no;

        parse_range(min[3], max[3], arg.substr(pos[2] + 1, pos[3] - pos[2] - 1));
    } catch (const std::invalid_argument&) {
        abort_parsing(argv, "invalid range specified (component " + std::to_string(component_no) + ")");
    }
}